

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIComboBox.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIComboBox::updateListButtonWidth(CGUIComboBox *this,s32 width)

{
  IGUIElement *this_00;
  int iVar1;
  rect<int> local_28;
  
  this_00 = &this->ListButton->super_IGUIElement;
  if ((this_00->RelativeRect).LowerRightCorner.X - (this_00->RelativeRect).UpperLeftCorner.X !=
      width) {
    iVar1 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
    local_28.UpperLeftCorner.Y = 2;
    local_28.UpperLeftCorner.X = (iVar1 - width) + -2;
    local_28.LowerRightCorner.Y = (*(int *)&this->field_0x3c - *(int *)&this->field_0x34) + -2;
    local_28.LowerRightCorner.X = iVar1 + -2;
    IGUIElement::setRelativePosition(this_00,&local_28);
    local_28.UpperLeftCorner.X = 2;
    local_28.UpperLeftCorner.Y = 2;
    local_28.LowerRightCorner.X =
         ((int)*(undefined8 *)&this->field_0x38 - (width + *(int *)&this->field_0x30)) + -2;
    local_28.LowerRightCorner.Y =
         ((int)((ulong)*(undefined8 *)&this->field_0x38 >> 0x20) - *(int *)&this->field_0x34) + -2;
    IGUIElement::setRelativePosition(&this->SelectedText->super_IGUIElement,&local_28);
  }
  return;
}

Assistant:

void CGUIComboBox::updateListButtonWidth(s32 width)
{
	if (ListButton->getRelativePosition().getWidth() != width) {
		core::rect<s32> r;
		r.UpperLeftCorner.X = RelativeRect.getWidth() - width - 2;
		r.LowerRightCorner.X = RelativeRect.getWidth() - 2;
		r.UpperLeftCorner.Y = 2;
		r.LowerRightCorner.Y = RelativeRect.getHeight() - 2;
		ListButton->setRelativePosition(r);

		r.UpperLeftCorner.X = 2;
		r.UpperLeftCorner.Y = 2;
		r.LowerRightCorner.X = RelativeRect.getWidth() - (width + 2);
		r.LowerRightCorner.Y = RelativeRect.getHeight() - 2;
		SelectedText->setRelativePosition(r);
	}
}